

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  Layer *pLVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Mat *pMVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  undefined4 *puVar34;
  long lVar35;
  byte bVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  float *pfVar42;
  int x;
  uint uVar43;
  int w_1;
  int iVar44;
  int iVar45;
  ulong uVar46;
  float *pfVar47;
  ulong uVar48;
  ulong uVar49;
  int iVar50;
  int y;
  long lVar51;
  undefined1 (*pauVar52) [16];
  int y_1;
  undefined4 *puVar53;
  int w;
  int iVar54;
  ulong uVar55;
  int iVar56;
  void *pvVar57;
  void *pvVar58;
  void *pvVar59;
  undefined1 auVar60 [16];
  undefined1 extraout_var [12];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar66;
  v4sf one;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [12];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [16];
  float fVar91;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int outh;
  int size;
  int h_1;
  int outh_1;
  int outw;
  Option opt_b;
  void *local_278;
  int local_270;
  int local_264;
  ulong local_260;
  ulong local_258;
  float *local_220;
  ulong local_1f8;
  Mat local_1b8;
  ulong local_168;
  void *local_160;
  undefined1 local_158 [16];
  Option *local_140;
  long local_138;
  Mat *local_130;
  int local_124;
  long local_120;
  void *local_118;
  void *local_110;
  int *local_108;
  size_t local_100;
  int local_f8;
  Allocator *local_f0;
  undefined4 local_e8;
  int iStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  size_t local_d0;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  long *local_a8;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  undefined8 local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar4 = bottom_blob->w;
  iVar5 = bottom_blob->h;
  uVar40 = bottom_blob->elemsize;
  local_168 = (ulong)bottom_blob->elempack;
  iVar27 = (this->super_Deconvolution).dilation_w;
  uVar39 = (this->super_Deconvolution).num_output;
  iVar38 = (this->super_Deconvolution).kernel_w;
  iVar28 = (this->super_Deconvolution).stride_w;
  iVar37 = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  local_138 = CONCAT44(local_138._4_4_,iVar37);
  iVar45 = (this->super_Deconvolution).stride_h;
  bVar36 = (uVar39 & 3) == 0 & opt->use_packing_layout;
  iVar56 = (this->super_Deconvolution).output_pad_right;
  iVar50 = (this->super_Deconvolution).output_pad_bottom;
  iVar44 = (uint)bVar36 + (uint)bVar36 * 2 + 1;
  uVar46 = (long)(int)uVar39 / (long)iVar44;
  iVar54 = (int)uVar46;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  auVar64._0_4_ = -(uint)(0 < (this->super_Deconvolution).pad_left);
  auVar64._4_4_ = -(uint)(0 < (this->super_Deconvolution).pad_right);
  auVar64._8_4_ = -(uint)(0 < (this->super_Deconvolution).pad_top);
  auVar64._12_4_ = -(uint)(0 < (this->super_Deconvolution).pad_bottom);
  iVar26 = movmskps(iVar54,auVar64);
  lVar51 = 0x10;
  if ((iVar26 == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar51 = 8, &local_1b8 != top_blob)))) {
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    lVar51 = 8;
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize = top_blob->elemsize;
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    uVar19 = top_blob->dims;
    uVar20 = top_blob->w;
    uVar21 = top_blob->h;
    uVar22 = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    local_1b8.dims = uVar19;
    local_1b8.w = uVar20;
    local_1b8.h = uVar21;
    local_1b8.d = uVar22;
  }
  uVar46 = uVar46 & 0xffffffff;
  iVar27 = (iVar38 + -1) * iVar27;
  local_160 = (void *)CONCAT44(local_160._4_4_,iVar27);
  iVar56 = (iVar4 + -1) * iVar28 + iVar27 + iVar56 + 1;
  local_140 = opt;
  local_130 = top_blob;
  Mat::create(&local_1b8,iVar56,iVar50 + 1 + (iVar5 + -1) * iVar45 + iVar37,iVar54,
              uVar40 / local_168 << bVar36 * '\x02',iVar44,*(Allocator **)(&opt->lightmode + lVar51)
             );
  iVar38 = local_1b8.h;
  iVar27 = local_1b8.w;
  auVar83 = _DAT_005b4860;
  auVar64 = _DAT_005b4820;
  iVar28 = -100;
  if ((local_1b8.data == (void *)0x0) || (local_1b8.cstep * (long)local_1b8.c == 0))
  goto LAB_0028dde6;
  uVar39 = (this->super_Deconvolution).kernel_w;
  uVar6 = (this->super_Deconvolution).kernel_h;
  iVar45 = uVar6 * uVar39;
  if (local_140->use_sgemm_convolution == true) {
    local_110 = bottom_blob->data;
    local_108 = bottom_blob->refcount;
    local_100 = bottom_blob->elemsize;
    local_f8 = bottom_blob->elempack;
    local_f0 = bottom_blob->allocator;
    uVar23 = bottom_blob->dims;
    uVar24 = bottom_blob->d;
    iVar27 = bottom_blob->w;
    iVar38 = bottom_blob->h;
    local_d8 = bottom_blob->c;
    local_d0 = bottom_blob->cstep;
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + 1;
      UNLOCK();
      iVar27 = bottom_blob->w;
      iVar38 = bottom_blob->h;
    }
    _local_e8 = CONCAT44(iVar38 * iVar27,uVar23);
    _uStack_e0 = CONCAT44(uVar24,1);
    local_88 = 0;
    local_c8 = (void *)0x0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_b8 = 0;
    uStack_b4 = 0;
    uStack_b0 = 0;
    local_a8 = (long *)0x0;
    uStack_a0 = 0;
    iStack_9c = 0;
    uStack_98 = 0;
    uStack_94 = 0;
    local_78._0_1_ = local_140->lightmode;
    local_78._1_1_ = local_140->use_shader_pack8;
    local_78._2_1_ = local_140->use_subgroup_ops;
    local_78._3_1_ = local_140->use_reserved_0;
    local_78._4_4_ = local_140->num_threads;
    local_68 = local_140->workspace_allocator;
    uStack_60._0_4_ = local_140->openmp_blocktime;
    uStack_60._4_1_ = local_140->use_winograd_convolution;
    uStack_60._5_1_ = local_140->use_sgemm_convolution;
    uStack_60._6_1_ = local_140->use_int8_inference;
    uStack_60._7_1_ = local_140->use_vulkan_compute;
    local_58._0_1_ = local_140->use_bf16_storage;
    local_58._1_1_ = local_140->use_fp16_packed;
    local_58._2_1_ = local_140->use_fp16_storage;
    local_58._3_1_ = local_140->use_fp16_arithmetic;
    local_58._4_1_ = local_140->use_int8_packed;
    local_58._5_1_ = local_140->use_int8_storage;
    local_58._6_1_ = local_140->use_int8_arithmetic;
    local_58._7_1_ = local_140->use_packing_layout;
    uStack_50._0_4_ = local_140->vulkan_device_index;
    uStack_50._4_1_ = local_140->use_reserved_1;
    uStack_50._5_1_ = local_140->use_image_storage;
    uStack_50._6_1_ = local_140->use_tensor_storage;
    uStack_50._7_1_ = local_140->use_reserved_2;
    local_48._0_4_ = local_140->flush_denormals;
    local_48._4_1_ = local_140->use_local_pool_allocator;
    local_48._5_1_ = local_140->use_shader_local_memory;
    local_48._6_1_ = local_140->use_cooperative_matrix;
    local_48._7_1_ = local_140->use_winograd23_convolution;
    uStack_40._0_1_ = local_140->use_winograd43_convolution;
    uStack_40._1_1_ = local_140->use_winograd63_convolution;
    uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_140->use_fp16_uniform;
    uStack_40._4_1_ = local_140->use_int8_uniform;
    uStack_40._5_1_ = local_140->use_reserved_9;
    uStack_40._6_1_ = local_140->use_reserved_10;
    uStack_40._7_1_ = local_140->use_reserved_11;
    pAStack_70 = local_1b8.allocator;
    iVar28 = (*this->gemm->_vptr_Layer[7])();
    auVar68 = _DAT_005aa0c0;
    auVar83 = _DAT_005aa0b0;
    auVar64 = _DAT_005aa0a0;
    if (iVar28 != 0) {
      piVar7 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_a8 == (long *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (**(code **)(*local_a8 + 0x18))();
          }
        }
      }
      if (local_108 != (int *)0x0) {
        LOCK();
        *local_108 = *local_108 + -1;
        UNLOCK();
        if (*local_108 == 0) {
          if (local_f0 == (Allocator *)0x0) {
            if (local_110 != (void *)0x0) {
              free(local_110);
            }
          }
          else {
            (*local_f0->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0028dde6;
    }
    iVar27 = iVar56 * (this->super_Deconvolution).stride_h -
             (this->super_Deconvolution).stride_w * iVar4 << bVar36 * '\x02';
    if (bVar36 == 0) {
      if (0 < iVar54) {
        lVar51 = (long)local_1b8.h * (long)local_1b8.w;
        local_1f8 = 0;
        pvVar12 = (this->super_Deconvolution).bias_data.data;
        iVar38 = (this->super_Deconvolution).bias_data.c;
        sVar13 = (this->super_Deconvolution).bias_data.cstep;
        iVar28 = (int)((local_1b8.elemsize * lVar51 + 0xf & 0xfffffffffffffff0) / local_1b8.elemsize
                      );
        if (local_1b8.dims == 4) {
          iVar28 = (int)lVar51;
        }
        uVar32 = iVar28 * local_1b8.d;
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar6 = (this->super_Deconvolution).kernel_h;
        uVar40 = CONCAT44(0,uVar32 + 3 & 0xfffffffc);
        lVar51 = (ulong)uVar32 - 1;
        auVar62._8_4_ = (int)lVar51;
        auVar62._0_8_ = lVar51;
        auVar62._12_4_ = (int)((ulong)lVar51 >> 0x20);
        lVar51 = (long)local_1b8.data + 0xc;
        auVar62 = auVar62 ^ _DAT_005aa0c0;
        local_158._0_8_ = uVar40;
        do {
          uVar84 = 0;
          if ((long)iVar38 * sVar13 != 0 && pvVar12 != (void *)0x0) {
            uVar84 = *(undefined4 *)((long)pvVar12 + local_1f8 * 4);
          }
          if (0 < (int)uVar32) {
            uVar49 = 0;
            do {
              auVar89._8_4_ = (int)uVar49;
              auVar89._0_8_ = uVar49;
              auVar89._12_4_ = (int)(uVar49 >> 0x20);
              auVar96 = (auVar89 | auVar83) ^ auVar68;
              iVar28 = auVar62._4_4_;
              if ((bool)(~(iVar28 < auVar96._4_4_ ||
                          auVar62._0_4_ < auVar96._0_4_ && auVar96._4_4_ == iVar28) & 1)) {
                *(undefined4 *)(lVar51 + -0xc + uVar49 * 4) = uVar84;
              }
              if (auVar96._12_4_ <= auVar62._12_4_ &&
                  (auVar96._8_4_ <= auVar62._8_4_ || auVar96._12_4_ != auVar62._12_4_)) {
                *(undefined4 *)(lVar51 + -8 + uVar49 * 4) = uVar84;
              }
              auVar96 = (auVar89 | auVar64) ^ auVar68;
              iVar56 = auVar96._4_4_;
              if (iVar56 <= iVar28 && (iVar56 != iVar28 || auVar96._0_4_ <= auVar62._0_4_)) {
                *(undefined4 *)(lVar51 + -4 + uVar49 * 4) = uVar84;
                *(undefined4 *)(lVar51 + uVar49 * 4) = uVar84;
              }
              uVar49 = uVar49 + 4;
            } while (uVar40 != uVar49);
          }
          if (0 < (int)uVar6) {
            pfVar47 = (float *)(local_1f8 *
                                (long)iVar45 * (long)iStack_9c * CONCAT44(uStack_b4,local_b8) +
                               (long)local_c8);
            iVar28 = (this->super_Deconvolution).dilation_h;
            iVar56 = (this->super_Deconvolution).dilation_w;
            uVar49 = 0;
            do {
              if (0 < (int)uVar39) {
                uVar48 = 0;
                do {
                  if (0 < iVar5) {
                    pfVar42 = (float *)((long)local_1b8.data +
                                       uVar48 * (long)iVar56 * 4 +
                                       uVar49 * (long)iVar28 *
                                                local_1b8.elemsize * (long)local_1b8.w +
                                       local_1b8.cstep * local_1b8.elemsize * local_1f8);
                    iVar50 = (this->super_Deconvolution).stride_w;
                    iVar54 = 0;
                    do {
                      iVar26 = iVar4;
                      if (0 < iVar4) {
                        do {
                          *pfVar42 = *pfVar42 + *pfVar47;
                          pfVar47 = pfVar47 + 1;
                          pfVar42 = pfVar42 + iVar50;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      pfVar42 = pfVar42 + iVar27;
                      iVar54 = iVar54 + 1;
                    } while (iVar54 != iVar5);
                  }
                  uVar48 = uVar48 + 1;
                } while (uVar48 != uVar39);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != uVar6);
          }
          local_1f8 = local_1f8 + 1;
          lVar51 = lVar51 + local_1b8.cstep * local_1b8.elemsize;
        } while (local_1f8 != uVar46);
      }
    }
    else if (0 < iVar54) {
      uVar40 = 0;
      do {
        sVar13 = local_1b8.elemsize;
        pfVar47 = (float *)((long)iStack_9c * uVar40 * (long)iVar45 * CONCAT44(uStack_b4,local_b8) +
                           (long)local_c8);
        lVar51 = (long)local_1b8.w;
        puVar53 = (undefined4 *)
                  (local_1b8.cstep * uVar40 * local_1b8.elemsize + (long)local_1b8.data);
        uVar48 = local_1b8.h * lVar51;
        uVar49 = (local_1b8.elemsize * uVar48 + 0xf & 0xfffffffffffffff0) / local_1b8.elemsize;
        if (local_1b8.dims == 4) {
          uVar49 = uVar48;
        }
        pvVar12 = (this->super_Deconvolution).bias_data.data;
        if ((pvVar12 == (void *)0x0) ||
           ((long)(this->super_Deconvolution).bias_data.c *
            (this->super_Deconvolution).bias_data.cstep == 0)) {
          uVar39 = local_1b8.d * (int)uVar49;
          if (0 < (int)uVar39) {
            memset(puVar53,0,(ulong)uVar39 << 4);
          }
        }
        else {
          iVar38 = local_1b8.d * (int)uVar49;
          if (0 < iVar38) {
            puVar34 = (undefined4 *)((long)pvVar12 + uVar40 * 0x10);
            uVar84 = *puVar34;
            uVar3 = puVar34[1];
            uVar17 = puVar34[2];
            uVar18 = puVar34[3];
            puVar34 = puVar53;
            do {
              *puVar34 = uVar84;
              puVar34[1] = uVar3;
              puVar34[2] = uVar17;
              puVar34[3] = uVar18;
              puVar34 = puVar34 + 4;
              iVar38 = iVar38 + -1;
            } while (iVar38 != 0);
          }
        }
        iVar38 = (this->super_Deconvolution).kernel_h;
        if (0 < iVar38) {
          iVar28 = (this->super_Deconvolution).kernel_w;
          iVar56 = 0;
          do {
            if (0 < iVar28) {
              iVar38 = 0;
              do {
                if (0 < iVar5) {
                  pfVar42 = (float *)((long)puVar53 +
                                     (long)((this->super_Deconvolution).dilation_w * iVar38 * 4) * 4
                                     + (long)(this->super_Deconvolution).dilation_h * (long)iVar56 *
                                       sVar13 * lVar51);
                  iVar28 = 0;
                  do {
                    iVar50 = iVar4;
                    if (0 < iVar4) {
                      do {
                        fVar63 = pfVar47[1];
                        auVar96._0_4_ = pfVar47[2];
                        fVar66 = pfVar47[3];
                        *pfVar42 = *pfVar47 + *pfVar42;
                        pfVar42[1] = fVar63 + pfVar42[1];
                        pfVar42[2] = auVar96._0_4_ + pfVar42[2];
                        pfVar42[3] = fVar66 + pfVar42[3];
                        pfVar42 = pfVar42 + (long)(this->super_Deconvolution).stride_w * 4;
                        pfVar47 = pfVar47 + 4;
                        iVar50 = iVar50 + -1;
                      } while (iVar50 != 0);
                    }
                    pfVar42 = pfVar42 + iVar27;
                    iVar28 = iVar28 + 1;
                  } while (iVar28 != iVar5);
                  iVar28 = (this->super_Deconvolution).kernel_w;
                }
                iVar38 = iVar38 + 1;
              } while (iVar38 < iVar28);
              iVar38 = (this->super_Deconvolution).kernel_h;
            }
            iVar56 = iVar56 + 1;
          } while (iVar56 < iVar38);
        }
        uVar40 = uVar40 + 1;
      } while (uVar40 != uVar46);
    }
    pLVar14 = this->activation;
    if (pLVar14 != (Layer *)0x0) {
      (*pLVar14->_vptr_Layer[9])(pLVar14,&local_1b8,local_140);
    }
    piVar7 = (int *)CONCAT44(uStack_bc,uStack_c0);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_a8 == (long *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (**(code **)(*local_a8 + 0x18))();
        }
      }
    }
    if (local_108 != (int *)0x0) {
      LOCK();
      *local_108 = *local_108 + -1;
      UNLOCK();
      if (*local_108 == 0) {
        if (local_f0 == (Allocator *)0x0) {
          if (local_110 != (void *)0x0) {
            free(local_110);
          }
        }
        else {
          (*local_f0->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    bVar36 = bVar36 ^ 1;
    local_124 = iVar45;
    if ((int)local_168 == 4 && bVar36 == 0) {
      if (local_1b8.c < 1) goto LAB_0028dda4;
      iVar4 = (this->super_Deconvolution).dilation_w;
      iVar5 = (this->super_Deconvolution).dilation_h;
      iVar28 = (this->super_Deconvolution).stride_w;
      iVar56 = (this->super_Deconvolution).stride_h;
      iVar50 = (this->super_Deconvolution).activation_type;
      pvVar12 = (this->super_Deconvolution).bias_data.data;
      local_260 = 0;
      fVar63 = (float)DAT_005b4860;
      auVar96._0_4_ = DAT_005b4860._4_4_;
      fVar66 = DAT_005b4860._8_4_;
      auVar68 = _DAT_005b4830;
      do {
        if (0 < local_1b8.h) {
          iVar54 = bottom_blob->w;
          iVar26 = bottom_blob->h;
          pauVar52 = (undefined1 (*) [16])
                     (local_1b8.cstep * local_260 * local_1b8.elemsize + (long)local_1b8.data);
          uVar32 = bottom_blob->c;
          local_270 = 0;
          do {
            if (0 < local_1b8.w) {
              uVar43 = 0;
              iVar37 = (1 - uVar39) * iVar4;
              do {
                auVar60 = ZEXT816(0);
                if (pvVar12 == (void *)0x0) {
                  auVar86 = ZEXT816(0);
                }
                else {
                  auVar86 = *(undefined1 (*) [16])((long)pvVar12 + local_260 * 0x10);
                }
                if (0 < (int)uVar32) {
                  pvVar57 = (void *)((this->weight_data_tm).cstep * local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar8 = bottom_blob->data;
                  lVar51 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar51;
                  uVar40 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar46 = 0;
                      uVar49 = 0;
                      do {
                        iVar44 = (((int)uVar49 - uVar6) + 1) * iVar5 + local_270;
                        if (((-1 < iVar44) && (iVar29 = iVar44 / iVar56, iVar44 % iVar56 == 0)) &&
                           ((0 < (int)uVar39 && (iVar29 < iVar26)))) {
                          lVar35 = iVar29 * lVar51 +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar40;
                          uVar48 = uVar46;
                          uVar55 = (ulong)uVar39;
                          iVar44 = iVar37;
                          do {
                            if (((-1 < iVar44) && (iVar29 = iVar44 / iVar28, iVar44 % iVar28 == 0))
                               && (iVar29 < iVar54)) {
                              lVar33 = (long)(iVar29 << 2);
                              fVar76 = *(float *)((long)pvVar8 + lVar33 * 4 + lVar35);
                              fVar67 = *(float *)((long)pvVar8 + lVar33 * 4 + lVar35 + 4);
                              uVar41 = uVar48 & 0xffffffff;
                              pfVar47 = (float *)((long)pvVar57 + uVar41 * 4);
                              fVar91 = *(float *)((long)pvVar8 + lVar33 * 4 + lVar35 + 8);
                              fVar100 = auVar86._4_4_;
                              fVar101 = auVar86._8_4_;
                              fVar102 = auVar86._12_4_;
                              fVar75 = *(float *)((long)pvVar8 + lVar33 * 4 + lVar35 + 0xc);
                              pfVar42 = (float *)((long)pvVar57 + uVar41 * 4 + 0x10);
                              pfVar1 = (float *)((long)pvVar57 + uVar41 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar57 + uVar41 * 4 + 0x30);
                              auVar86._0_4_ =
                                   fVar75 * *pfVar2 +
                                   fVar91 * *pfVar1 + fVar67 * *pfVar42 +
                                   fVar76 * *pfVar47 + auVar86._0_4_;
                              auVar86._4_4_ =
                                   fVar75 * pfVar2[1] +
                                   fVar91 * pfVar1[1] + fVar67 * pfVar42[1] +
                                   fVar76 * pfVar47[1] + fVar100;
                              auVar86._8_4_ =
                                   fVar75 * pfVar2[2] +
                                   fVar91 * pfVar1[2] + fVar67 * pfVar42[2] +
                                   fVar76 * pfVar47[2] + fVar101;
                              auVar86._12_4_ =
                                   fVar75 * pfVar2[3] +
                                   fVar91 * pfVar1[3] + fVar67 * pfVar42[3] +
                                   fVar76 * pfVar47[3] + fVar102;
                            }
                            uVar48 = uVar48 + 0x10;
                            iVar44 = iVar44 + iVar4;
                            uVar55 = uVar55 - 1;
                          } while (uVar55 != 0);
                        }
                        uVar49 = uVar49 + 1;
                        uVar46 = uVar46 + (ulong)uVar39 * 0x10;
                      } while (uVar49 != uVar6);
                    }
                    pvVar57 = (void *)((long)pvVar57 + (long)(int)(uVar39 * uVar6 * 0x10) * 4);
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar32);
                }
                fVar67 = auVar86._4_4_;
                fVar91 = auVar86._8_4_;
                fVar75 = auVar86._12_4_;
                fVar76 = auVar83._12_4_;
                switch(iVar50) {
                case 1:
                  auVar86 = maxps(auVar86,auVar60);
                  break;
                case 2:
                  auVar70 = maxps(auVar86,auVar60);
                  auVar60 = minps(auVar86,auVar60);
                  fVar76 = *(this->super_Deconvolution).activation_params.data;
                  auVar86._4_4_ = fVar76 * auVar60._4_4_ + auVar70._4_4_;
                  auVar86._0_4_ = fVar76 * auVar60._0_4_ + auVar70._0_4_;
                  auVar86._8_4_ = fVar76 * auVar60._8_4_ + auVar70._8_4_;
                  auVar86._12_4_ = fVar76 * auVar60._12_4_ + auVar70._12_4_;
                  break;
                case 3:
                  puVar53 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar84 = *puVar53;
                  uVar3 = puVar53[1];
                  auVar69._4_4_ = uVar84;
                  auVar69._0_4_ = uVar84;
                  auVar69._8_4_ = uVar84;
                  auVar69._12_4_ = uVar84;
                  auVar92._4_4_ = uVar3;
                  auVar92._0_4_ = uVar3;
                  auVar92._8_4_ = uVar3;
                  auVar92._12_4_ = uVar3;
                  auVar60 = maxps(auVar86,auVar69);
                  auVar86 = minps(auVar60,auVar92);
                  break;
                case 4:
                  auVar85._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                  auVar85._8_4_ = -fVar91;
                  auVar85._12_4_ = -fVar75;
                  auVar60 = minps(auVar85,auVar64);
                  auVar60 = maxps(auVar60,auVar68);
                  fVar91 = auVar60._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar60._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar60._8_4_ * 1.442695 + 0.5;
                  fVar90 = auVar60._12_4_ * 1.442695 + 0.5;
                  fVar67 = (float)(int)fVar91;
                  fVar75 = (float)(int)fVar100;
                  fVar101 = (float)(int)fVar102;
                  fVar103 = (float)(int)fVar90;
                  fVar67 = fVar67 - (float)(-(uint)(fVar91 < fVar67) & (uint)fVar63);
                  fVar75 = fVar75 - (float)(-(uint)(fVar100 < fVar75) & (uint)auVar96._0_4_);
                  fVar101 = fVar101 - (float)(-(uint)(fVar102 < fVar101) & (uint)fVar66);
                  fVar103 = fVar103 - (float)(-(uint)(fVar90 < fVar103) & (uint)fVar76);
                  fVar91 = fVar67 * -0.6931472 + auVar60._0_4_;
                  fVar100 = fVar75 * -0.6931472 + auVar60._4_4_;
                  fVar102 = fVar101 * -0.6931472 + auVar60._8_4_;
                  fVar90 = fVar103 * -0.6931472 + auVar60._12_4_;
                  auVar93._0_4_ =
                       (float)((int)fVar67 * 0x800000 + (int)fVar63) *
                       (fVar91 + fVar63 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91) +
                       fVar63;
                  auVar93._4_4_ =
                       (float)((int)fVar75 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar100 + auVar96._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar96._0_4_;
                  auVar93._8_4_ =
                       (float)((int)fVar101 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar93._12_4_ =
                       (float)((int)fVar103 * 0x800000 + (int)fVar76) *
                       (fVar90 + fVar76 +
                       (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90
                         + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90) +
                       fVar76;
                  auVar86 = divps(auVar83,auVar93);
                  break;
                case 5:
                  auVar60 = minps(auVar86,auVar64);
                  auVar68 = maxps(auVar60,auVar68);
                  fVar100 = auVar68._0_4_ * 1.442695 + 0.5;
                  fVar101 = auVar68._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar68._8_4_ * 1.442695 + 0.5;
                  fVar103 = auVar68._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar99 = (float)(int)fVar103;
                  fVar90 = fVar90 - (float)(-(uint)(fVar100 < fVar90) & (uint)fVar63);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)auVar96._0_4_);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar66);
                  fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar76);
                  fVar100 = auVar68._0_4_ - fVar90 * 0.6931472;
                  fVar101 = auVar68._4_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar68._8_4_ - fVar98 * 0.6931472;
                  fVar103 = auVar68._12_4_ - fVar99 * 0.6931472;
                  auVar104._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar63) *
                       (fVar100 + fVar63 +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + fVar63;
                  auVar104._4_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar101 + auVar96._0_4_ +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + auVar96._0_4_;
                  auVar104._8_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar104._12_4_ =
                       (float)((int)fVar99 * 0x800000 + (int)fVar76) *
                       (fVar103 + fVar76 +
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                       fVar103 * fVar103) + fVar76;
                  auVar68 = maxps(auVar104,_DAT_005b48d0);
                  fVar100 = (float)(auVar68._0_4_ & 0x807fffff | 0x3f000000);
                  fVar102 = (float)(auVar68._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar68._8_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar68._12_4_ & 0x807fffff | 0x3f000000);
                  fVar101 = fVar100 + (float)DAT_005b4910 +
                            (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
                  fVar103 = fVar102 + DAT_005b4910._4_4_ +
                            (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                  fVar97 = fVar90 + DAT_005b4910._8_4_ +
                           (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar99 = fVar98 + DAT_005b4910._12_4_ +
                           (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  auVar77._0_4_ =
                       ~-(uint)(auVar104._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar63)) * 0.6931472 +
                               fVar101 +
                              (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984)
                                     * fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                                  -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                                fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
                  auVar77._4_4_ =
                       ~-(uint)(auVar104._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar102 < 0.70710677) & (uint)auVar96._0_4_)) *
                               0.6931472 + fVar103 +
                              (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984)
                                     * fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                                  -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                                fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
                  auVar77._8_4_ =
                       ~-(uint)(auVar104._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar77._12_4_ =
                       ~-(uint)(auVar104._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar76)) * 0.6931472 +
                               fVar99 + (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 +
                                               0.116769984) * fVar99 + -0.12420141) * fVar99 +
                                             0.14249323) * fVar99 + -0.16668057) * fVar99 +
                                           0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                                         * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar68._0_8_ =
                       CONCAT44(-(uint)(auVar104._4_4_ <= 0.0),-(uint)(auVar104._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar68._8_4_ = -(uint)(auVar104._8_4_ <= 0.0) & 0x7fffffff;
                  auVar68._12_4_ = -(uint)(auVar104._12_4_ <= 0.0) & 0x7fffffff;
                  auVar68 = minps(auVar68 | auVar77,auVar64);
                  auVar68 = maxps(auVar68,_DAT_005b4830);
                  fVar100 = auVar68._0_4_ * 1.442695 + 0.5;
                  fVar101 = auVar68._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar68._8_4_ * 1.442695 + 0.5;
                  fVar103 = auVar68._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar99 = (float)(int)fVar103;
                  fVar90 = fVar90 - (float)(-(uint)(fVar100 < fVar90) & (uint)fVar63);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)auVar96._0_4_);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar66);
                  fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar76);
                  fVar100 = auVar68._0_4_ - fVar90 * 0.6931472;
                  fVar101 = auVar68._4_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar68._8_4_ - fVar98 * 0.6931472;
                  fVar103 = auVar68._12_4_ - fVar99 * 0.6931472;
                  auVar78._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar63) *
                       (fVar100 + fVar63 +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + fVar63;
                  auVar78._4_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar101 + auVar96._0_4_ +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + auVar96._0_4_;
                  auVar78._8_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar78._12_4_ =
                       (float)((int)fVar99 * 0x800000 + (int)fVar76) *
                       (fVar103 + fVar76 +
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                       fVar103 * fVar103) + fVar76;
                  auVar68 = divps(_DAT_005b54e0,auVar78);
                  auVar60._0_4_ = auVar68._0_4_ + (float)DAT_005b4910;
                  auVar60._4_4_ = auVar68._4_4_ + DAT_005b4910._4_4_;
                  auVar60._8_4_ = auVar68._8_4_ + DAT_005b4910._8_4_;
                  auVar60._12_4_ = auVar68._12_4_ + DAT_005b4910._12_4_;
                  auVar68 = _DAT_005b4830;
                  goto LAB_0028c6db;
                case 6:
                  pfVar47 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar76 = *pfVar47;
                  fVar100 = pfVar47[1];
                  auVar70._0_4_ = fVar76 * auVar86._0_4_ + fVar100;
                  auVar70._4_4_ = fVar76 * fVar67 + fVar100;
                  auVar70._8_4_ = fVar76 * fVar91 + fVar100;
                  auVar70._12_4_ = fVar76 * fVar75 + fVar100;
                  auVar60 = maxps(auVar70,auVar60);
                  auVar60 = minps(auVar60,auVar83);
LAB_0028c6db:
                  auVar86._0_4_ = auVar86._0_4_ * auVar60._0_4_;
                  auVar86._4_4_ = fVar67 * auVar60._4_4_;
                  auVar86._8_4_ = fVar91 * auVar60._8_4_;
                  auVar86._12_4_ = fVar75 * auVar60._12_4_;
                }
                *pauVar52 = auVar86;
                pauVar52 = pauVar52 + 1;
                uVar43 = uVar43 + 1;
                iVar37 = iVar37 + 1;
              } while (uVar43 != local_1b8.w);
            }
            local_270 = local_270 + 1;
          } while (local_270 != local_1b8.h);
        }
        local_260 = local_260 + 1;
      } while (local_260 != (long)local_1b8.c);
    }
    auVar83 = _DAT_005b4860;
    auVar64 = _DAT_005b4820;
    if ((int)local_168 == 1 && bVar36 == 0) {
      if ((long)local_1b8.c < 1) goto LAB_0028dda4;
      iVar4 = (this->super_Deconvolution).dilation_w;
      iVar5 = (this->super_Deconvolution).dilation_h;
      iVar28 = (this->super_Deconvolution).stride_w;
      iVar56 = (this->super_Deconvolution).stride_h;
      iVar50 = (this->super_Deconvolution).activation_type;
      pvVar12 = (this->super_Deconvolution).bias_data.data;
      uVar39 = (this->super_Deconvolution).kernel_w;
      uVar6 = (this->super_Deconvolution).kernel_h;
      local_260 = 0;
      auVar60 = (undefined1  [16])0x0;
      fVar63 = (float)DAT_005b4860;
      auVar96._0_4_ = DAT_005b4860._4_4_;
      fVar66 = DAT_005b4860._8_4_;
      auVar68 = _DAT_005b4830;
      do {
        if (0 < local_1b8.h) {
          iVar54 = bottom_blob->w;
          iVar26 = bottom_blob->h;
          pauVar52 = (undefined1 (*) [16])
                     (local_1b8.cstep * local_260 * local_1b8.elemsize + (long)local_1b8.data);
          uVar32 = bottom_blob->c;
          local_270 = 0;
          do {
            if (0 < local_1b8.w) {
              uVar43 = 0;
              iVar37 = (1 - uVar39) * iVar4;
              do {
                if (pvVar12 == (void *)0x0) {
                  auVar88 = ZEXT816(0);
                }
                else {
                  auVar88 = *(undefined1 (*) [16])((long)pvVar12 + local_260 * 0x10);
                }
                if (0 < (int)uVar32) {
                  pvVar57 = (void *)((this->weight_data_tm).cstep * local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  lVar51 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_158._0_8_ = lVar51;
                  uVar40 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar46 = 0;
                      uVar49 = 0;
                      do {
                        iVar44 = (((int)uVar49 - uVar6) + 1) * iVar5 + local_270;
                        if (((-1 < iVar44) && (iVar29 = iVar44 / iVar56, iVar44 % iVar56 == 0)) &&
                           ((iVar29 < iVar26 && (0 < (int)uVar39)))) {
                          uVar48 = (ulong)uVar39;
                          uVar55 = uVar46;
                          auVar86 = auVar88;
                          iVar44 = iVar37;
                          do {
                            auVar88 = auVar86;
                            if (((-1 < iVar44) && (iVar30 = iVar44 / iVar28, iVar44 % iVar28 == 0))
                               && (iVar30 < iVar54)) {
                              fVar76 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar30 * 4 +
                                                 iVar29 * lVar51 +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar40
                                                 );
                              pfVar47 = (float *)((long)pvVar57 + (uVar55 & 0xffffffff) * 4);
                              auVar88._0_4_ = auVar86._0_4_ + fVar76 * *pfVar47;
                              auVar88._4_4_ = auVar86._4_4_ + fVar76 * pfVar47[1];
                              auVar88._8_4_ = auVar86._8_4_ + fVar76 * pfVar47[2];
                              auVar88._12_4_ = auVar86._12_4_ + fVar76 * pfVar47[3];
                            }
                            uVar55 = uVar55 + 4;
                            iVar44 = iVar44 + iVar4;
                            uVar48 = uVar48 - 1;
                            auVar86 = auVar88;
                          } while (uVar48 != 0);
                        }
                        uVar49 = uVar49 + 1;
                        uVar46 = uVar46 + (ulong)uVar39 * 4;
                      } while (uVar49 != uVar6);
                    }
                    pvVar57 = (void *)((long)pvVar57 + (long)(int)(uVar39 * uVar6 * 4) * 4);
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar32);
                }
                fVar67 = auVar88._4_4_;
                fVar91 = auVar88._8_4_;
                fVar75 = auVar88._12_4_;
                fVar76 = auVar83._12_4_;
                switch(iVar50) {
                case 1:
                  auVar88 = maxps(auVar88,auVar60);
                  break;
                case 2:
                  auVar86 = maxps(auVar88,auVar60);
                  auVar70 = minps(auVar88,auVar60);
                  fVar76 = *(this->super_Deconvolution).activation_params.data;
                  auVar88._4_4_ = fVar76 * auVar70._4_4_ + auVar86._4_4_;
                  auVar88._0_4_ = fVar76 * auVar70._0_4_ + auVar86._0_4_;
                  auVar88._8_4_ = fVar76 * auVar70._8_4_ + auVar86._8_4_;
                  auVar88._12_4_ = fVar76 * auVar70._12_4_ + auVar86._12_4_;
                  break;
                case 3:
                  puVar53 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar84 = *puVar53;
                  uVar3 = puVar53[1];
                  auVar72._4_4_ = uVar84;
                  auVar72._0_4_ = uVar84;
                  auVar72._8_4_ = uVar84;
                  auVar72._12_4_ = uVar84;
                  auVar94._4_4_ = uVar3;
                  auVar94._0_4_ = uVar3;
                  auVar94._8_4_ = uVar3;
                  auVar94._12_4_ = uVar3;
                  auVar86 = maxps(auVar88,auVar72);
                  auVar88 = minps(auVar86,auVar94);
                  break;
                case 4:
                  auVar87._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                  auVar87._8_4_ = -fVar91;
                  auVar87._12_4_ = -fVar75;
                  auVar86 = minps(auVar87,auVar64);
                  auVar86 = maxps(auVar86,auVar68);
                  fVar91 = auVar86._0_4_ * 1.442695 + 0.5;
                  fVar100 = auVar86._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar86._8_4_ * 1.442695 + 0.5;
                  fVar90 = auVar86._12_4_ * 1.442695 + 0.5;
                  fVar67 = (float)(int)fVar91;
                  fVar75 = (float)(int)fVar100;
                  fVar101 = (float)(int)fVar102;
                  fVar103 = (float)(int)fVar90;
                  fVar67 = fVar67 - (float)(-(uint)(fVar91 < fVar67) & (uint)fVar63);
                  fVar75 = fVar75 - (float)(-(uint)(fVar100 < fVar75) & (uint)auVar96._0_4_);
                  fVar101 = fVar101 - (float)(-(uint)(fVar102 < fVar101) & (uint)fVar66);
                  fVar103 = fVar103 - (float)(-(uint)(fVar90 < fVar103) & (uint)fVar76);
                  fVar91 = fVar67 * -0.6931472 + auVar86._0_4_;
                  fVar100 = fVar75 * -0.6931472 + auVar86._4_4_;
                  fVar102 = fVar101 * -0.6931472 + auVar86._8_4_;
                  fVar90 = fVar103 * -0.6931472 + auVar86._12_4_;
                  auVar95._0_4_ =
                       (float)((int)fVar67 * 0x800000 + (int)fVar63) *
                       (fVar91 + fVar63 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91) +
                       fVar63;
                  auVar95._4_4_ =
                       (float)((int)fVar75 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar100 + auVar96._0_4_ +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + auVar96._0_4_;
                  auVar95._8_4_ =
                       (float)((int)fVar101 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar95._12_4_ =
                       (float)((int)fVar103 * 0x800000 + (int)fVar76) *
                       (fVar90 + fVar76 +
                       (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 + 0.008333452) * fVar90
                         + 0.041665796) * fVar90 + 0.16666666) * fVar90 + 0.5) * fVar90 * fVar90) +
                       fVar76;
                  auVar88 = divps(auVar83,auVar95);
                  break;
                case 5:
                  auVar60 = minps(auVar88,auVar64);
                  auVar68 = maxps(auVar60,auVar68);
                  fVar100 = auVar68._0_4_ * 1.442695 + 0.5;
                  fVar101 = auVar68._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar68._8_4_ * 1.442695 + 0.5;
                  fVar103 = auVar68._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar99 = (float)(int)fVar103;
                  fVar90 = fVar90 - (float)(-(uint)(fVar100 < fVar90) & (uint)fVar63);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)auVar96._0_4_);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar66);
                  fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar76);
                  fVar100 = auVar68._0_4_ - fVar90 * 0.6931472;
                  fVar101 = auVar68._4_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar68._8_4_ - fVar98 * 0.6931472;
                  fVar103 = auVar68._12_4_ - fVar99 * 0.6931472;
                  auVar105._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar63) *
                       (fVar100 + fVar63 +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + fVar63;
                  auVar105._4_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar101 + auVar96._0_4_ +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + auVar96._0_4_;
                  auVar105._8_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar105._12_4_ =
                       (float)((int)fVar99 * 0x800000 + (int)fVar76) *
                       (fVar103 + fVar76 +
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                       fVar103 * fVar103) + fVar76;
                  auVar68 = maxps(auVar105,_DAT_005b48d0);
                  fVar100 = (float)(auVar68._0_4_ & 0x807fffff | 0x3f000000);
                  fVar102 = (float)(auVar68._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar68._8_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar68._12_4_ & 0x807fffff | 0x3f000000);
                  fVar101 = fVar100 + -1.0 + (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
                  fVar103 = fVar102 + -1.0 + (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                  fVar97 = fVar90 + -1.0 + (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar99 = fVar98 + -1.0 + (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  auVar79._0_4_ =
                       ~-(uint)(auVar105._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar63)) * 0.6931472 +
                               fVar101 +
                              (((((((((fVar101 * 0.070376836 + -0.1151461) * fVar101 + 0.116769984)
                                     * fVar101 + -0.12420141) * fVar101 + 0.14249323) * fVar101 +
                                  -0.16668057) * fVar101 + 0.20000714) * fVar101 + -0.24999994) *
                                fVar101 + 0.3333333) * fVar101 + -0.5) * fVar101 * fVar101) * -2.0);
                  auVar79._4_4_ =
                       ~-(uint)(auVar105._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar102 < 0.70710677) & (uint)auVar96._0_4_)) *
                               0.6931472 + fVar103 +
                              (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984)
                                     * fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                                  -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                                fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
                  auVar79._8_4_ =
                       ~-(uint)(auVar105._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar66)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar79._12_4_ =
                       ~-(uint)(auVar105._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar68._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar76)) * 0.6931472 +
                               fVar99 + (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 +
                                               0.116769984) * fVar99 + -0.12420141) * fVar99 +
                                             0.14249323) * fVar99 + -0.16668057) * fVar99 +
                                           0.20000714) * fVar99 + -0.24999994) * fVar99 + 0.3333333)
                                         * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar71._0_8_ =
                       CONCAT44(-(uint)(auVar105._4_4_ <= 0.0),-(uint)(auVar105._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar71._8_4_ = -(uint)(auVar105._8_4_ <= 0.0) & 0x7fffffff;
                  auVar71._12_4_ = -(uint)(auVar105._12_4_ <= 0.0) & 0x7fffffff;
                  auVar68 = minps(auVar71 | auVar79,auVar64);
                  auVar68 = maxps(auVar68,_DAT_005b4830);
                  fVar100 = auVar68._0_4_ * 1.442695 + 0.5;
                  fVar101 = auVar68._4_4_ * 1.442695 + 0.5;
                  fVar102 = auVar68._8_4_ * 1.442695 + 0.5;
                  fVar103 = auVar68._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar100;
                  fVar97 = (float)(int)fVar101;
                  fVar98 = (float)(int)fVar102;
                  fVar99 = (float)(int)fVar103;
                  fVar90 = fVar90 - (float)(-(uint)(fVar100 < fVar90) & (uint)fVar63);
                  fVar97 = fVar97 - (float)(-(uint)(fVar101 < fVar97) & (uint)auVar96._0_4_);
                  fVar98 = fVar98 - (float)(-(uint)(fVar102 < fVar98) & (uint)fVar66);
                  fVar99 = fVar99 - (float)(-(uint)(fVar103 < fVar99) & (uint)fVar76);
                  fVar100 = auVar68._0_4_ - fVar90 * 0.6931472;
                  fVar101 = auVar68._4_4_ - fVar97 * 0.6931472;
                  fVar102 = auVar68._8_4_ - fVar98 * 0.6931472;
                  fVar103 = auVar68._12_4_ - fVar99 * 0.6931472;
                  auVar60 = ZEXT816(0);
                  auVar80._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar63) *
                       (fVar100 + fVar63 +
                       (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                          fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                       fVar100 * fVar100) + fVar63;
                  auVar80._4_4_ =
                       (float)((int)fVar97 * 0x800000 + (int)auVar96._0_4_) *
                       (fVar101 + auVar96._0_4_ +
                       (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) *
                          fVar101 + 0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5) *
                       fVar101 * fVar101) + auVar96._0_4_;
                  auVar80._8_4_ =
                       (float)((int)fVar98 * 0x800000 + (int)fVar66) *
                       (fVar102 + fVar66 +
                       (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                          fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                       fVar102 * fVar102) + fVar66;
                  auVar80._12_4_ =
                       (float)((int)fVar99 * 0x800000 + (int)fVar76) *
                       (fVar103 + fVar76 +
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                       fVar103 * fVar103) + fVar76;
                  auVar68 = divps(_DAT_005b54e0,auVar80);
                  auVar74._0_4_ = auVar68._0_4_ + -1.0;
                  auVar74._4_4_ = auVar68._4_4_ + -1.0;
                  auVar74._8_4_ = auVar68._8_4_ + -1.0;
                  auVar74._12_4_ = auVar68._12_4_ + -1.0;
                  auVar68 = _DAT_005b4830;
                  goto LAB_0028cd9c;
                case 6:
                  pfVar47 = (float *)(this->super_Deconvolution).activation_params.data;
                  fVar76 = *pfVar47;
                  fVar100 = pfVar47[1];
                  auVar73._0_4_ = fVar76 * auVar88._0_4_ + fVar100;
                  auVar73._4_4_ = fVar76 * fVar67 + fVar100;
                  auVar73._8_4_ = fVar76 * fVar91 + fVar100;
                  auVar73._12_4_ = fVar76 * fVar75 + fVar100;
                  auVar86 = maxps(auVar73,auVar60);
                  auVar74 = minps(auVar86,auVar83);
LAB_0028cd9c:
                  auVar88._0_4_ = auVar88._0_4_ * auVar74._0_4_;
                  auVar88._4_4_ = fVar67 * auVar74._4_4_;
                  auVar88._8_4_ = fVar91 * auVar74._8_4_;
                  auVar88._12_4_ = fVar75 * auVar74._12_4_;
                }
                *pauVar52 = auVar88;
                pauVar52 = pauVar52 + 1;
                uVar43 = uVar43 + 1;
                iVar37 = iVar37 + 1;
              } while (uVar43 != local_1b8.w);
            }
            local_270 = local_270 + 1;
          } while (local_270 != local_1b8.h);
        }
        local_260 = local_260 + 1;
      } while (local_260 != (long)local_1b8.c);
    }
    auVar64 = local_158;
    if (((int)local_168 == 4) && (bVar36 != 0)) {
      lVar51 = (long)local_1b8.c;
      if (0 < lVar51) {
        iVar4 = (this->super_Deconvolution).dilation_w;
        iVar5 = (this->super_Deconvolution).dilation_h;
        iVar28 = (this->super_Deconvolution).stride_w;
        iVar45 = (this->super_Deconvolution).stride_h;
        iVar56 = (this->super_Deconvolution).activation_type;
        pvVar12 = (this->super_Deconvolution).bias_data.data;
        uVar39 = (this->super_Deconvolution).kernel_w;
        uVar6 = (this->super_Deconvolution).kernel_h;
        local_160 = local_1b8.data;
        local_138 = local_1b8.elemsize * local_1b8.cstep;
        iVar50 = bottom_blob->w;
        iVar54 = bottom_blob->h;
        uVar32 = bottom_blob->c;
        local_260 = 0;
        do {
          if (0 < iVar38) {
            sVar13 = (this->weight_data_tm).cstep;
            sVar9 = (this->weight_data_tm).elemsize;
            local_220 = (float *)(local_138 * local_260 + (long)local_160);
            pvVar57 = (this->weight_data_tm).data;
            iVar26 = 0;
            do {
              if (0 < iVar27) {
                iVar44 = bottom_blob->w;
                pvVar8 = bottom_blob->data;
                sVar10 = bottom_blob->elemsize;
                sVar11 = bottom_blob->cstep;
                pfVar47 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar43 = 0;
                iVar37 = (1 - uVar39) * iVar4;
                do {
                  if (pvVar12 == (void *)0x0) {
                    fVar63 = 0.0;
                  }
                  else {
                    fVar63 = *(float *)((long)pvVar12 + local_260 * 4);
                  }
                  if ((int)uVar32 < 1) {
                    auVar65 = ZEXT816(0);
                  }
                  else {
                    auVar65 = ZEXT816(0);
                    uVar40 = 0;
                    pvVar59 = (void *)(sVar13 * local_260 * sVar9 + (long)pvVar57);
                    do {
                      local_158._0_8_ = uVar40;
                      if (0 < (int)uVar6) {
                        uVar46 = 0;
                        uVar49 = 0;
                        do {
                          iVar29 = (((int)uVar49 - uVar6) + 1) * iVar5 + iVar26;
                          if ((((-1 < iVar29) && (iVar30 = iVar29 / iVar45, iVar29 % iVar45 == 0))
                              && (0 < (int)uVar39)) && (iVar30 < iVar54)) {
                            uVar48 = (ulong)uVar39;
                            uVar55 = uVar46;
                            auVar64 = auVar65;
                            iVar29 = iVar37;
                            do {
                              auVar65 = auVar64;
                              if (((-1 < iVar29) && (iVar31 = iVar29 / iVar28, iVar29 % iVar28 == 0)
                                  ) && (iVar31 < iVar50)) {
                                pfVar42 = (float *)((long)pvVar59 + (uVar55 & 0xffffffff) * 4);
                                pfVar1 = (float *)((long)pvVar8 +
                                                  (long)(iVar31 << 2) * 4 +
                                                  (long)iVar30 * (long)iVar44 * sVar10 +
                                                  sVar11 * sVar10 * uVar40);
                                auVar65._0_4_ = auVar64._0_4_ + *pfVar42 * *pfVar1;
                                auVar65._4_4_ = auVar64._4_4_ + pfVar42[1] * pfVar1[1];
                                auVar65._8_4_ = auVar64._8_4_ + pfVar42[2] * pfVar1[2];
                                auVar65._12_4_ = auVar64._12_4_ + pfVar42[3] * pfVar1[3];
                              }
                              uVar55 = uVar55 + 4;
                              iVar29 = iVar29 + iVar4;
                              uVar48 = uVar48 - 1;
                              auVar64 = auVar65;
                            } while (uVar48 != 0);
                          }
                          uVar49 = uVar49 + 1;
                          uVar46 = uVar46 + (ulong)uVar39 * 4;
                        } while (uVar49 != uVar6);
                      }
                      pvVar59 = (void *)((long)pvVar59 + (long)(int)(uVar39 * uVar6 * 4) * 4);
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != uVar32);
                  }
                  auVar82._4_4_ = auVar65._12_4_ + auVar65._4_4_;
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._4_4_;
                  auVar82._12_4_ = auVar82._4_4_;
                  auVar96._4_12_ = auVar82._4_12_;
                  auVar96._0_4_ = auVar82._4_4_ + fVar63 + auVar65._8_4_ + auVar65._0_4_;
                  fVar63 = auVar96._0_4_;
                  switch(iVar56) {
                  case 1:
                    if (auVar96._0_4_ <= 0.0) {
                      auVar15._12_4_ = 0;
                      auVar15._0_12_ = auVar96._4_12_;
                      auVar96 = auVar15 << 0x20;
                    }
LAB_0028d125:
                    fVar63 = auVar96._0_4_;
                    break;
                  case 2:
                    fVar63 = (float)(~-(uint)(0.0 < auVar96._0_4_) & (uint)*pfVar47 |
                                    -(uint)(0.0 < auVar96._0_4_) & 0x3f800000) * auVar96._0_4_;
                    break;
                  case 3:
                    if (auVar96._0_4_ <= *pfVar47) {
                      auVar96._0_4_ = *pfVar47;
                    }
                    fVar63 = auVar96._0_4_;
                    if (pfVar47[1] < auVar96._0_4_) {
                      fVar63 = pfVar47[1];
                    }
                    break;
                  case 4:
                    if (88.37626 <= auVar96._0_4_) {
                      auVar96._0_4_ = 88.37626;
                    }
                    fVar63 = expf((float)(-(uint)(auVar96._0_4_ < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(auVar96._0_4_ < -88.37626) & (uint)-auVar96._0_4_)
                                 );
                    fVar63 = 1.0 / (fVar63 + 1.0);
                    break;
                  case 5:
                    local_158 = auVar96;
                    fVar63 = expf(auVar96._0_4_);
                    fVar63 = logf(fVar63 + 1.0);
                    fVar63 = tanhf(fVar63);
                    fVar63 = fVar63 * (float)local_158._0_4_;
                    break;
                  case 6:
                    fVar66 = *pfVar47;
                    fVar76 = -pfVar47[1] / fVar66;
                    fVar63 = 0.0;
                    if (fVar76 <= auVar96._0_4_) {
                      if (fVar76 + 1.0 / fVar66 < auVar96._0_4_) goto LAB_0028d125;
                      fVar63 = (fVar66 * auVar96._0_4_ + pfVar47[1]) * auVar96._0_4_;
                    }
                  }
                  *local_220 = fVar63;
                  local_220 = local_220 + 1;
                  uVar43 = uVar43 + 1;
                  iVar37 = iVar37 + 1;
                } while (uVar43 != iVar27);
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != iVar38);
          }
          local_260 = local_260 + 1;
        } while (local_260 != lVar51);
      }
    }
    else if ((bVar36 == 1 && (int)local_168 == 1) &&
            (local_168 = (ulong)(this->super_Deconvolution).num_output, 0 < (long)local_168)) {
      local_118 = local_1b8.data;
      local_120 = local_1b8.cstep * local_1b8.elemsize;
      iVar4 = bottom_blob->w;
      iVar5 = bottom_blob->h;
      local_158._4_4_ = 0;
      local_158._0_4_ = bottom_blob->c;
      local_158._8_8_ = auVar64._8_8_;
      uVar40 = (ulong)(uint)local_1b8.w;
      lVar51 = (long)local_1b8.w;
      local_160 = (void *)CONCAT44(local_160._4_4_,-(int)local_160);
      local_260 = 0;
      do {
        if (0 < iVar38) {
          local_278 = (void *)(local_120 * local_260 + (long)local_118);
          iVar28 = (this->super_Deconvolution).bias_term;
          iVar56 = (this->super_Deconvolution).activation_type;
          sVar13 = (this->weight_data_tm).cstep;
          sVar9 = (this->weight_data_tm).elemsize;
          pvVar12 = (this->weight_data_tm).data;
          local_264 = 0;
          do {
            if (0 < iVar27) {
              pvVar57 = (this->super_Deconvolution).bias_data.data;
              iVar50 = bottom_blob->w;
              pvVar8 = bottom_blob->data;
              sVar10 = bottom_blob->elemsize;
              sVar11 = bottom_blob->cstep;
              uVar39 = (this->super_Deconvolution).kernel_h;
              iVar54 = local_264 - (int)local_138;
              pfVar47 = (float *)(this->super_Deconvolution).activation_params.data;
              local_258 = (ulong)local_160 & 0xffffffff;
              uVar46 = 0;
              do {
                if (iVar28 == 0) {
                  auVar81 = ZEXT812(0);
                }
                else {
                  auVar81._4_8_ = 0;
                  auVar81._0_4_ = *(uint *)((long)pvVar57 + local_260 * 4);
                }
                auVar83._12_4_ = 0;
                auVar83._0_12_ = auVar81;
                if (0 < (int)local_158._0_4_) {
                  iVar26 = (this->super_Deconvolution).stride_h;
                  uVar6 = (this->super_Deconvolution).kernel_w;
                  iVar37 = (this->super_Deconvolution).stride_w;
                  lVar35 = 0;
                  pvVar59 = (void *)(sVar13 * sVar9 * local_260 + (long)pvVar12);
                  do {
                    if (0 < (int)uVar39) {
                      uVar49 = 0;
                      pvVar58 = pvVar59;
                      do {
                        iVar44 = (this->super_Deconvolution).dilation_h * (int)uVar49 + iVar54;
                        if ((((-1 < iVar44) && (iVar29 = iVar44 / iVar26, iVar44 % iVar26 == 0)) &&
                            (iVar29 < iVar5)) && (0 < (int)uVar6)) {
                          uVar48 = 0;
                          iVar44 = (int)local_258;
                          do {
                            if (((-1 < iVar44) && (iVar30 = iVar44 / iVar37, iVar44 % iVar37 == 0))
                               && (iVar30 < iVar4)) {
                              auVar83._0_4_ =
                                   auVar83._0_4_ +
                                   *(float *)((long)pvVar58 + uVar48 * 4) *
                                   *(float *)((long)pvVar8 +
                                             (long)iVar30 * 4 +
                                             (long)iVar29 * (long)iVar50 * sVar10 +
                                             sVar11 * sVar10 * lVar35);
                            }
                            uVar48 = uVar48 + 1;
                            iVar44 = iVar44 + (this->super_Deconvolution).dilation_w;
                          } while (uVar6 != uVar48);
                        }
                        uVar49 = uVar49 + 1;
                        pvVar58 = (void *)((long)pvVar58 + (ulong)uVar6 * 4);
                      } while (uVar49 != uVar39);
                    }
                    lVar35 = lVar35 + 1;
                    pvVar59 = (void *)((long)pvVar59 + (long)iVar45 * 4);
                  } while (lVar35 != local_158._0_8_);
                }
                fVar63 = auVar83._0_4_;
                auVar61 = auVar83;
                switch(iVar56) {
                case 1:
                  if (fVar63 <= 0.0) {
                    auVar16._12_4_ = 0;
                    auVar16._0_12_ = auVar83._4_12_;
                    auVar61 = auVar16 << 0x20;
                  }
                  break;
                case 2:
                  auVar61 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar63) & (uint)*pfVar47 |
                                                  -(uint)(0.0 < fVar63) & 0x3f800000) * fVar63));
                  break;
                case 3:
                  if (fVar63 <= *pfVar47) {
                    auVar83._0_4_ = *pfVar47;
                  }
                  fVar63 = pfVar47[1];
                  auVar61 = auVar83;
                  if (fVar63 < auVar83._0_4_) {
LAB_0028d900:
                    auVar61 = ZEXT416((uint)fVar63);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar63) {
                    fVar63 = 88.37626;
                  }
                  fVar63 = expf((float)(-(uint)(fVar63 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar63 < -88.37626) & (uint)-fVar63));
                  auVar61 = ZEXT416((uint)(1.0 / (fVar63 + 1.0)));
                  break;
                case 5:
                  auVar96._0_4_ = expf(fVar63);
                  auVar96._0_4_ = logf(auVar96._0_4_ + 1.0);
                  auVar96._0_4_ = tanhf(auVar96._0_4_);
                  auVar61._0_4_ = auVar96._0_4_ * fVar63;
                  auVar61._4_12_ = extraout_var;
                  break;
                case 6:
                  auVar96._0_4_ = *pfVar47;
                  fVar66 = -pfVar47[1] / auVar96._0_4_;
                  auVar61 = ZEXT816(0);
                  if ((fVar66 <= fVar63) &&
                     (auVar61 = auVar83, fVar63 <= fVar66 + 1.0 / auVar96._0_4_)) {
                    fVar63 = (auVar96._0_4_ * fVar63 + pfVar47[1]) * fVar63;
                    goto LAB_0028d900;
                  }
                }
                *(int *)((long)local_278 + uVar46 * 4) = auVar61._0_4_;
                uVar46 = uVar46 + 1;
                local_258 = (ulong)((int)local_258 + 1);
              } while (uVar46 != uVar40);
            }
            local_278 = (void *)((long)local_278 + lVar51 * 4);
            local_264 = local_264 + 1;
          } while (local_264 != iVar38);
        }
        local_260 = local_260 + 1;
      } while (local_260 != local_168);
    }
  }
LAB_0028dda4:
  pMVar25 = local_130;
  Deconvolution::cut_padding(&this->super_Deconvolution,&local_1b8,local_130,local_140);
  if ((pMVar25->data == (void *)0x0) || (iVar28 = 0, (long)pMVar25->c * pMVar25->cstep == 0)) {
    iVar28 = -100;
  }
LAB_0028dde6:
  piVar7 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}